

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O2

bool __thiscall QTest::invokeTestMethodIfValid(QTest *this,QMetaMethod m,QObject *obj)

{
  long lVar1;
  IfNotOldStyleArgs<bool> IVar2;
  long in_FS_OFFSET;
  QMetaMethod m_local;
  
  m_local.data.d = (uint *)m.mobj;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  m_local.mobj = (QMetaObject *)this;
  if (this == (QTest *)0x0) {
    IVar2 = false;
  }
  else {
    IVar2 = QMetaMethod::invoke<>(&m_local,(QObject *)m.data.d.d,DirectConnection);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return IVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool invokeTestMethodIfValid(QMetaMethod m, QObject *obj = QTest::currentTestObject)
{
    if (!m.isValid())
        return false;
    bool ok = true;
    try { ok = m.invoke(obj, Qt ::DirectConnection); }
    catch (const TestFailedException &) {}  // ignore (used for control flow)
    catch (const TestSkippedException &) {} // ditto
    // every other exception is someone else's problem
    return ok;
}